

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool libcellml::traverseHierarchyAndRemoveIfEmpty(ComponentPtr *component)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  string local_80;
  string local_60;
  string local_40;
  
  sVar2 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar2 != 0) {
    do {
      sVar2 = sVar2 - 1;
      ComponentEntity::component
                ((ComponentEntity *)&local_80,
                 (size_t)(component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      bVar1 = traverseHierarchyAndRemoveIfEmpty((ComponentPtr *)&local_80);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
      }
      if (bVar1) {
        ComponentEntity::removeComponent
                  (&((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    super_ComponentEntity,sVar2);
      }
    } while (sVar2 != 0);
  }
  sVar2 = Component::variableCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  sVar3 = Component::resetCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  sVar4 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar4 + sVar3 + sVar2 == 0) {
    Component::math_abi_cxx11_
              (&local_80,
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (bVar1 = ImportedEntity::isImport
                          (&((component->
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->super_ImportedEntity), bVar1)) {
      bVar1 = false;
    }
    else {
      NamedEntity::name_abi_cxx11_
                (&local_60,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      if (local_60._M_string_length == 0) {
        Entity::id_abi_cxx11_
                  (&local_40,
                   (Entity *)
                   (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr);
        bVar1 = local_40._M_string_length == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar1 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool traverseHierarchyAndRemoveIfEmpty(const ComponentPtr &component)
{
    for (size_t i = component->componentCount() - 1; i != MAX_SIZE_T; --i) {
        if (traverseHierarchyAndRemoveIfEmpty(component->component(i))) {
            component->removeComponent(i);
        }
    }

    return (component->variableCount() + component->resetCount() + component->componentCount() == 0)
           && component->math().empty()
           && !component->isImport()
           && component->name().empty()
           && component->id().empty();
}